

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

Duration * __thiscall absl::lts_20250127::Duration::operator/=(Duration *this,int64_t r)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  bool bVar5;
  uint32_t uVar6;
  HiRep HVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  
  uVar1 = this->rep_lo_;
  if (r == 0 || uVar1 == 0xffffffff) {
    HVar7 = (HiRep)((ulong)((long)((ulong)(this->rep_hi_).hi_ << 0x20 ^ r) < 0) + 0x7fffffffffffffff
                   );
    uVar3 = 0xffffffff;
  }
  else {
    HVar7 = this->rep_hi_;
    uVar2 = 4000000000 - uVar1;
    if (-1 < (long)HVar7) {
      uVar2 = uVar1;
    }
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (long)HVar7 >> 0x3f ^ (ulong)HVar7;
    auVar10 = auVar10 * ZEXT816(4000000000) + ZEXT416(uVar2);
    uVar8 = -(r >> 0x3f);
    uVar4 = r >> 0x3f ^ r;
    auVar10 = __udivti3(auVar10._0_8_,auVar10._8_8_,uVar4 + uVar8,CARRY8(uVar4,uVar8));
    uVar8 = auVar10._8_8_;
    uVar4 = auVar10._0_8_;
    uVar9 = (ulong)HVar7 ^ r;
    if (uVar8 == 0) {
      HVar7 = (HiRep)(uVar4 / 4000000000);
      uVar6 = auVar10._0_4_ + HVar7.lo_ * 0x1194d800;
    }
    else {
      if (uVar8 < 2000000000) {
        HVar7 = (HiRep)__udivti3(uVar4,uVar8,4000000000,0);
        uVar3 = HVar7.lo_ * 0x1194d800;
        uVar6 = auVar10._0_4_ + uVar3;
      }
      else {
        HVar7.lo_ = 0;
        HVar7.hi_ = 0x80000000;
        if (-1 < (long)uVar9) {
          HVar7.lo_ = 0xffffffff;
          HVar7.hi_ = 0x7fffffff;
        }
        bVar5 = -1 < (long)uVar9 || (uVar4 != 0 || uVar8 != 2000000000);
        uVar6 = (uint32_t)CONCAT71(0x7fffffffffffff,bVar5);
        uVar3 = -(uint)bVar5;
      }
      if (1999999999 < uVar8) goto LAB_00246d6c;
    }
    uVar3 = uVar6;
    if ((long)uVar9 < 0) {
      if (uVar3 == 0) {
        HVar7 = (HiRep)-(long)HVar7;
        uVar3 = 0;
      }
      else {
        HVar7 = (HiRep)~(ulong)HVar7;
        uVar3 = 4000000000 - uVar3;
      }
    }
  }
LAB_00246d6c:
  this->rep_hi_ = HVar7;
  this->rep_lo_ = uVar3;
  return this;
}

Assistant:

Duration& Duration::operator/=(int64_t r) {
  if (time_internal::IsInfiniteDuration(*this) || r == 0) {
    const bool is_neg = (r < 0) != (rep_hi_.Get() < 0);
    return *this = is_neg ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this = ScaleFixed<std::divides>(*this, r);
}